

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  long this_00;
  bool bVar2;
  longlong lVar3;
  ulong uVar4;
  TrackPosition *pTVar5;
  longlong size_;
  TrackPosition *local_d0;
  TrackPosition *tp;
  longlong size_2;
  longlong id_2;
  long len_2;
  TrackPosition *p;
  ulong local_90;
  TrackPosition *local_88;
  longlong local_80;
  longlong size_1;
  longlong id_1;
  long len_1;
  unsigned_long_long track_positions_count;
  longlong pos;
  longlong element_size;
  longlong size;
  longlong id;
  long len;
  longlong stop;
  longlong element_start;
  longlong pos_;
  IMkvReader *pReader_local;
  CuePoint *this_local;
  
  if (this->m_timecode < 0) {
    pos_ = (longlong)pReader;
    pReader_local = (IMkvReader *)this;
    if (this->m_track_positions != (TrackPosition *)0x0) {
      __assert_fail("m_track_positions == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8e7,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    if (this->m_track_positions_count != 0) {
      __assert_fail("m_track_positions_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8e8,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    stop = -this->m_timecode;
    element_start = stop;
    size = ReadID(pReader,stop,&id);
    if (size == 0xbb) {
      element_start = id + element_start;
      element_size = ReadUInt((IMkvReader *)pos_,element_start,&id);
      if (element_size < 0) {
        __assert_fail("size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8f9,"bool mkvparser::CuePoint::Load(IMkvReader *)");
      }
      track_positions_count = id + element_start;
      len = track_positions_count + element_size;
      pos = len - stop;
      len_1 = 0;
      element_start = track_positions_count;
      for (; (long)track_positions_count < len;
          track_positions_count = local_80 + track_positions_count) {
        size_1 = ReadID((IMkvReader *)pos_,track_positions_count,&id_1);
        if ((size_1 < 0) || (len < (long)(track_positions_count + id_1))) {
          return false;
        }
        track_positions_count = id_1 + track_positions_count;
        local_80 = ReadUInt((IMkvReader *)pos_,track_positions_count,&id_1);
        if ((local_80 < 0) || (len < (long)(track_positions_count + id_1))) {
          return false;
        }
        track_positions_count = id_1 + track_positions_count;
        if (len < (long)(track_positions_count + local_80)) {
          return false;
        }
        if (size_1 == 0xb3) {
          lVar3 = UnserializeUInt((IMkvReader *)pos_,track_positions_count,local_80);
          this->m_timecode = lVar3;
        }
        else if ((size_1 == 0xb7) && (len_1 = len_1 + 1, 0xffffffff < (ulong)len_1)) {
          return true;
        }
      }
      this->m_track_positions_count = len_1;
      if ((this->m_timecode < 0) || (this->m_track_positions_count == 0)) {
        this_local._7_1_ = false;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this->m_track_positions_count;
        uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
        if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        pTVar5 = (TrackPosition *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
        p._7_1_ = pTVar5 != (TrackPosition *)0x0;
        local_d0 = (TrackPosition *)0x0;
        if ((bool)p._7_1_) {
          local_d0 = pTVar5;
          local_90 = uVar4;
          local_88 = pTVar5;
        }
        this->m_track_positions = local_d0;
        if (this->m_track_positions == (TrackPosition *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          len_2 = (long)this->m_track_positions;
          track_positions_count = element_start;
          do {
            if (len <= (long)track_positions_count) {
              if ((len_2 - (long)this->m_track_positions) / 0x18 == this->m_track_positions_count) {
                this->m_element_start = stop;
                this->m_element_size = pos;
                return true;
              }
              __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x956,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            lVar3 = ReadID((IMkvReader *)pos_,track_positions_count,&id_2);
            if ((lVar3 < 0) || (len < (long)(track_positions_count + id_2))) {
              return false;
            }
            track_positions_count = id_2 + track_positions_count;
            size_ = ReadUInt((IMkvReader *)pos_,track_positions_count,&id_2);
            this_00 = len_2;
            if (size_ < 0) {
              __assert_fail("size >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            if (len < (long)(track_positions_count + id_2)) {
              __assert_fail("(pos + len) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x945,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            track_positions_count = id_2 + track_positions_count;
            if (len < (long)(track_positions_count + size_)) {
              __assert_fail("(pos + size) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x948,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            if (lVar3 == 0xb7) {
              len_2 = len_2 + 0x18;
              bVar2 = TrackPosition::Parse
                                ((TrackPosition *)this_00,(IMkvReader *)pos_,track_positions_count,
                                 size_);
              if (!bVar2) {
                return false;
              }
            }
            track_positions_count = size_ + track_positions_count;
          } while ((long)track_positions_count <= len);
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}